

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

GLMClassifier * __thiscall
CoreML::Specification::GLMClassifier::New(GLMClassifier *this,Arena *arena)

{
  GLMClassifier *this_00;
  GLMClassifier *n;
  Arena *arena_local;
  GLMClassifier *this_local;
  
  this_00 = (GLMClassifier *)operator_new(0x58);
  GLMClassifier(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GLMClassifier>(arena,this_00);
  }
  return this_00;
}

Assistant:

GLMClassifier* GLMClassifier::New(::google::protobuf::Arena* arena) const {
  GLMClassifier* n = new GLMClassifier;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}